

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O2

JSValue js_os_setTimeout(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int *piVar1;
  long lVar2;
  int iVar3;
  JSRuntime *rt;
  void *pvVar4;
  long *opaque;
  int64_t iVar5;
  JSValueUnion JVar6;
  ulong uVar7;
  JSValueUnion JVar8;
  JSRefCountHeader *p;
  JSValue JVar9;
  JSValue JVar10;
  int64_t iStack_50;
  int64_t delay;
  
  rt = JS_GetRuntime(ctx);
  pvVar4 = JS_GetRuntimeOpaque(rt);
  piVar1 = (int *)(argv->u).ptr;
  lVar2 = argv->tag;
  iVar3 = JS_IsFunction(ctx,*argv);
  if (iVar3 == 0) {
    JVar9 = JS_ThrowTypeError(ctx,"not a function");
    JVar6 = JVar9.u;
    JVar9.tag = JVar9.tag;
    JVar9.u.float64 = -NAN;
    JVar8 = JVar6;
  }
  else {
    iVar3 = JS_ToInt64(ctx,&delay,argv[1]);
    iStack_50 = 6;
    if (iVar3 != 0) {
      JVar8.float64 = 0.0;
      uVar7 = 0;
      goto LAB_00110c58;
    }
    JVar9 = JS_NewObjectClass(ctx,js_os_timer_class_id);
    if ((int)JVar9.tag != 6) {
      opaque = (long *)js_mallocz(ctx,0x30);
      if (opaque == (long *)0x0) {
        JS_FreeValue(ctx,JVar9);
        JVar8.float64 = 0.0;
        uVar7 = 0;
        iStack_50 = 6;
        goto LAB_00110c58;
      }
      *(undefined4 *)(opaque + 2) = 1;
      iVar5 = get_time_ms();
      opaque[3] = iVar5 + delay;
      if (0xfffffff4 < (uint)lVar2) {
        *piVar1 = *piVar1 + 1;
      }
      opaque[4] = (long)piVar1;
      opaque[5] = lVar2;
      lVar2 = *(long *)((long)pvVar4 + 0x20);
      *(long **)(lVar2 + 8) = opaque;
      *opaque = lVar2;
      opaque[1] = (long)pvVar4 + 0x20;
      *(long **)((long)pvVar4 + 0x20) = opaque;
      JS_SetOpaque(JVar9,opaque);
    }
    JVar6.float64 = -NAN;
    JVar8 = JVar9.u;
  }
  iStack_50 = JVar9.tag;
  uVar7 = (ulong)JVar9.u.ptr & (ulong)JVar6.ptr;
LAB_00110c58:
  JVar10.u.ptr = (void *)((ulong)JVar8.ptr & 0xffffffff | uVar7);
  JVar10.tag = iStack_50;
  return JVar10;
}

Assistant:

static JSValue js_os_setTimeout(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv)
{
    JSRuntime *rt = JS_GetRuntime(ctx);
    JSThreadState *ts = JS_GetRuntimeOpaque(rt);
    int64_t delay;
    JSValueConst func;
    JSOSTimer *th;
    JSValue obj;

    func = argv[0];
    if (!JS_IsFunction(ctx, func))
        return JS_ThrowTypeError(ctx, "not a function");
    if (JS_ToInt64(ctx, &delay, argv[1]))
        return JS_EXCEPTION;
    obj = JS_NewObjectClass(ctx, js_os_timer_class_id);
    if (JS_IsException(obj))
        return obj;
    th = js_mallocz(ctx, sizeof(*th));
    if (!th) {
        JS_FreeValue(ctx, obj);
        return JS_EXCEPTION;
    }
    th->has_object = TRUE;
    th->timeout = get_time_ms() + delay;
    th->func = JS_DupValue(ctx, func);
    list_add_tail(&th->link, &ts->os_timers);
    JS_SetOpaque(obj, th);
    return obj;
}